

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O1

string * __thiscall
soul::ASTUtilities::
getSpecialisationSignature<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>,std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
          (string *__return_storage_ptr__,ASTUtilities *this,
          vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
          *params,ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *args)

{
  string *psVar1;
  StructurePtr o;
  long lVar2;
  long lVar3;
  pointer ppVar4;
  ASTObject *pAVar5;
  unsigned_long v;
  Type targetType;
  stringstream key;
  string local_208;
  string *local_1e8;
  long local_1e0;
  long local_1d8;
  Type local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar3 = *(long *)this;
  if (*(long *)(this + 8) != lVar3) {
    ppVar4 = (pointer)0x0;
    do {
      if (ppVar4 != (pointer)0x0) {
        local_208._M_dataplus._M_p._0_1_ = 0x2c;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_208,1);
      }
      lVar2 = *(long *)(lVar3 + (long)ppVar4 * 8);
      if (lVar2 == 0) {
        lVar2 = 0;
      }
      else {
        lVar2 = __dynamic_cast(lVar2,&AST::ASTObject::typeinfo,&AST::UsingDeclaration::typeinfo,0);
      }
      if (lVar2 == 0) {
        lVar2 = *(long *)(lVar3 + (long)ppVar4 * 8);
        if (lVar2 == 0) {
          lVar2 = 0;
        }
        else {
          lVar2 = __dynamic_cast(lVar2,&AST::ASTObject::typeinfo,&AST::VariableDeclaration::typeinfo
                                 ,0);
        }
        if (lVar2 == 0) {
          lVar2 = *(long *)(lVar3 + (long)ppVar4 * 8);
          if (lVar2 == 0) {
            lVar2 = 0;
          }
          else {
            lVar2 = __dynamic_cast(lVar2,&AST::ASTObject::typeinfo,
                                   &AST::NamespaceAliasDeclaration::typeinfo,0);
          }
          if (lVar2 == 0) {
            lVar3 = *(long *)(lVar3 + (long)ppVar4 * 8);
            if (lVar3 == 0) {
              lVar3 = 0;
            }
            else {
              lVar3 = __dynamic_cast(lVar3,&AST::ASTObject::typeinfo,
                                     &AST::ProcessorAliasDeclaration::typeinfo,0);
            }
            if (lVar3 == 0) {
              throwInternalCompilerError("getSpecialisationSignature",0xed);
            }
            choc::text::createHexString<unsigned_long>
                      (&local_208,*(unsigned_long *)(lVar3 + 0x38),0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          }
          else {
            if (ppVar4 < (params->
                         super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
              pAVar5 = (params->
                       super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[(long)ppVar4].object;
              if (pAVar5 == (ASTObject *)0x0) {
                lVar3 = 0;
              }
              else {
                lVar3 = __dynamic_cast(pAVar5,&AST::Expression::typeinfo,
                                       &AST::NamespaceRef::typeinfo,0);
              }
              if (lVar3 == 0) {
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              v = *(unsigned_long *)(lVar3 + 0x30);
            }
            else {
              v = *(unsigned_long *)(lVar2 + 0x40);
            }
            choc::text::createHexString<unsigned_long>(&local_208,v,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          }
        }
        else {
          if (ppVar4 < (params->
                       super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
            (*((params->
               super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
               )._M_impl.super__Vector_impl_data._M_start[(long)ppVar4].object)->_vptr_ASTObject
              [0xd])(&local_1d8);
            lVar3 = local_1d8;
            if (local_1d8 == 0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
          }
          else {
            if (*(long **)(lVar2 + 0x38) == (long *)0x0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
            (**(code **)(**(long **)(lVar2 + 0x38) + 0x68))(&local_1e0);
            lVar3 = local_1e0;
            if (local_1e0 == 0) {
              throwInternalCompilerError("object != nullptr","operator->",0x3c);
            }
          }
          if (*(long *)(lVar3 + 0x58) == 0) {
            ArrayWithPreallocation<unsigned_char,_8UL>::resize
                      ((ArrayWithPreallocation<unsigned_char,_8UL> *)(lVar3 + 0x50),
                       *(size_t *)(lVar3 + 0x48));
          }
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_208,*(long *)(lVar3 + 0x50),
                     *(long *)(lVar3 + 0x48) + *(long *)(lVar3 + 0x50));
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (ppVar4 < (params->
                     super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
          pAVar5 = (params->
                   super__Vector_base<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[(long)ppVar4].object;
        }
        else {
          pAVar5 = *(ASTObject **)(lVar2 + 0x38);
          if (pAVar5 == (ASTObject *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
        }
        (*pAVar5->_vptr_ASTObject[5])(&local_1d0);
        o.object = local_1d0.structure.object;
        if (local_1d0.category == structure) {
          if (local_1d0.structure.object != (Structure *)0x0) {
            ((local_1d0.structure.object)->super_RefCountedObject).refCount =
                 ((local_1d0.structure.object)->super_RefCountedObject).refCount + 1;
          }
          choc::text::createHexString<unsigned_long>
                    (&local_208,(unsigned_long)local_1d0.structure.object,0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
        }
        else {
          Type::getShortIdentifierDescription_abi_cxx11_(&local_208,&local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_1d0.structure.object);
      }
      ppVar4 = (pointer)((long)&ppVar4->object + 1);
      lVar3 = *(long *)this;
    } while (ppVar4 < (pointer)(*(long *)(this + 8) - lVar3 >> 3));
  }
  psVar1 = local_1e8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

static std::string getSpecialisationSignature (const ParamList& params, const ArgList& args)
    {
        std::stringstream key;

        for (size_t i = 0; i < params.size(); ++i)
        {
            auto& param = params[i];

            if (i > 0)
                key << ',';

            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                auto targetType = (i < args.size()) ? args[i]->resolveAsType() : u->targetType->resolveAsType();

                if (targetType.isStruct())
                    key << getSignatureString (targetType.getStruct().get());
                else
                    key << targetType.getShortIdentifierDescription();

                continue;
            }

            if (auto v = cast<AST::VariableDeclaration> (param))
            {
                auto& value = (i < args.size()) ?  args[i]->getAsConstant()->value : v->initialValue->getAsConstant()->value;
                key << std::string (static_cast<const char*> (value.getPackedData()), value.getPackedDataSize());
                continue;
            }

            if (auto v = cast<AST::NamespaceAliasDeclaration> (param))
            {
                auto ns = (i < args.size()) ? cast<AST::NamespaceRef> (args[i])->ns : v->resolvedNamespace;
                key << getSignatureString (ns.get());
                continue;
            }

            if (auto v = cast<AST::ProcessorAliasDeclaration> (param))
            {
                key << getSignatureString (v->resolvedProcessor.get());
                continue;
            }

            SOUL_ASSERT_FALSE;
        }

        return key.str();
    }